

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O1

void __thiscall
CommandDrawInventoryBar::Parse(CommandDrawInventoryBar *this,FScanner *sc,bool fullScreenOffsets)

{
  bool bVar1;
  EColorRange EVar2;
  FFont *pFVar3;
  
  FScanner::MustGetToken(sc,0x101);
  bVar1 = FScanner::Compare(sc,"Doom");
  if (bVar1) {
    this->style = STYLE_Doom;
  }
  else {
    bVar1 = FScanner::Compare(sc,"Heretic");
    if (bVar1) {
      this->style = STYLE_Heretic;
    }
    else {
      bVar1 = FScanner::Compare(sc,"Hexen");
      if (bVar1) {
        this->style = STYLE_Hexen;
      }
      else {
        bVar1 = FScanner::Compare(sc,"HexenStrict");
        if (bVar1) {
          this->style = STYLE_HexenStrict;
        }
        else {
          bVar1 = FScanner::Compare(sc,"Strife");
          if (bVar1) {
            this->style = STYLE_Strife;
          }
          else {
            FScanner::ScriptError(sc,"Unknown style \'%s\'.",sc->String);
          }
        }
      }
    }
  }
  FScanner::MustGetToken(sc,0x2c);
  bVar1 = FScanner::CheckToken(sc,0x101);
  if (bVar1) {
    do {
      bVar1 = FScanner::Compare(sc,"alwaysshow");
      if (bVar1) {
        this->alwaysShow = true;
      }
      else {
        bVar1 = FScanner::Compare(sc,"drawshadow");
        if (bVar1) {
          bVar1 = FScanner::CheckToken(sc,0x28);
          if (bVar1) {
            FScanner::MustGetToken(sc,0x104);
            this->shadowX = sc->Number;
            FScanner::MustGetToken(sc,0x2c);
            FScanner::MustGetToken(sc,0x104);
            this->shadowY = sc->Number;
            FScanner::MustGetToken(sc,0x29);
          }
          this->shadow = true;
        }
        else {
          bVar1 = FScanner::Compare(sc,"noartibox");
          if (bVar1) {
            this->noArtibox = true;
          }
          else {
            bVar1 = FScanner::Compare(sc,"noarrows");
            if (bVar1) {
              this->noArrows = true;
            }
            else {
              bVar1 = FScanner::Compare(sc,"alwaysshowcounter");
              if (bVar1) {
                this->alwaysShowCounter = true;
              }
              else {
                bVar1 = FScanner::Compare(sc,"translucent");
                if (bVar1) {
                  this->translucent = true;
                }
                else {
                  bVar1 = FScanner::Compare(sc,"vertical");
                  if (bVar1) {
                    this->vertical = true;
                  }
                  else {
                    FScanner::ScriptError(sc,"Unknown flag \'%s\'.",sc->String);
                  }
                }
              }
            }
          }
        }
      }
      bVar1 = FScanner::CheckToken(sc,0x7c);
      if (!bVar1) {
        FScanner::MustGetToken(sc,0x2c);
      }
      bVar1 = FScanner::CheckToken(sc,0x101);
    } while (bVar1);
  }
  FScanner::MustGetToken(sc,0x104);
  this->size = sc->Number;
  FScanner::MustGetToken(sc,0x2c);
  bVar1 = FScanner::CheckToken(sc,0x102);
  if (!bVar1) {
    FScanner::MustGetToken(sc,0x101);
  }
  pFVar3 = V_GetFont(sc->String);
  this->font = pFVar3;
  if (pFVar3 == (FFont *)0x0) {
    FScanner::ScriptError(sc,"Unknown font \'%s\'.",sc->String);
    this->font = SmallFont;
  }
  FScanner::MustGetToken(sc,0x2c);
  SBarInfoCommand::GetCoordinates
            (&this->super_SBarInfoCommand,sc,fullScreenOffsets,&this->x,&this->y);
  this->counterX = (SBarInfoCoordinate)((int)this->x + 0x34);
  this->counterY = (SBarInfoCoordinate)((int)this->y + 0x2c);
  bVar1 = FScanner::CheckToken(sc,0x2c);
  if (bVar1) {
    SBarInfoCommand::GetCoordinates
              (&this->super_SBarInfoCommand,sc,fullScreenOffsets,&this->counterX,&this->counterY);
    bVar1 = FScanner::CheckToken(sc,0x2c);
    if (bVar1) {
      EVar2 = SBarInfoCommand::GetTranslation(&this->super_SBarInfoCommand,sc);
      this->translation = EVar2;
      bVar1 = FScanner::CheckToken(sc,0x2c);
      if (bVar1) {
        FScanner::MustGetToken(sc,0x104);
        this->fontSpacing = sc->Number;
      }
    }
  }
  FScanner::MustGetToken(sc,0x3b);
  return;
}

Assistant:

void	Parse(FScanner &sc, bool fullScreenOffsets)
		{
			sc.MustGetToken(TK_Identifier);
			if(sc.Compare("Doom"))
				style = STYLE_Doom;
			else if(sc.Compare("Heretic"))
				style = STYLE_Heretic;
			else if(sc.Compare("Hexen"))
				style = STYLE_Hexen;
			else if(sc.Compare("HexenStrict"))
				style = STYLE_HexenStrict;
			else if(sc.Compare("Strife"))
				style = STYLE_Strife;
			else
				sc.ScriptError("Unknown style '%s'.", sc.String);
		
			sc.MustGetToken(',');
			while(sc.CheckToken(TK_Identifier))
			{
				if(sc.Compare("alwaysshow"))
					alwaysShow = true;
				else if(sc.Compare("drawshadow"))
				{
					if(sc.CheckToken('('))
					{
						sc.MustGetToken(TK_IntConst);
						shadowX = sc.Number;
						sc.MustGetToken(',');
						sc.MustGetToken(TK_IntConst);
						shadowY = sc.Number;
						sc.MustGetToken(')');
					}
					shadow = true;
				}
				else if(sc.Compare("noartibox"))
					noArtibox = true;
				else if(sc.Compare("noarrows"))
					noArrows = true;
				else if(sc.Compare("alwaysshowcounter"))
					alwaysShowCounter = true;
				else if(sc.Compare("translucent"))
					translucent = true;
				else if(sc.Compare("vertical"))
					vertical = true;
				else
					sc.ScriptError("Unknown flag '%s'.", sc.String);
				if(!sc.CheckToken('|'))
					sc.MustGetToken(',');
			}
			sc.MustGetToken(TK_IntConst);
			size = sc.Number;
			sc.MustGetToken(',');
			if(!sc.CheckToken(TK_StringConst))
				sc.MustGetToken(TK_Identifier);
			font = V_GetFont(sc.String);
			if(font == NULL)
			{
				sc.ScriptError("Unknown font '%s'.", sc.String);
				font = SmallFont;
			}
		
			sc.MustGetToken(',');
			GetCoordinates(sc, fullScreenOffsets, x, y);
			counterX = x + 26;
			counterY = y + 22;
			if(sc.CheckToken(',')) //more font information
			{
				GetCoordinates(sc, fullScreenOffsets, counterX, counterY);
				if(sc.CheckToken(','))
				{
					translation = GetTranslation(sc);
					if(sc.CheckToken(','))
					{
						sc.MustGetToken(TK_IntConst);
						fontSpacing = sc.Number;
					}
				}
			}
			sc.MustGetToken(';');
		}